

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

JavascriptMethod __thiscall
Js::ScriptFunction::UpdateThunkEntryPoint
          (ScriptFunction *this,FunctionEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  JavascriptMethod p_Var5;
  undefined4 *puVar6;
  FunctionBody *this_00;
  FunctionInfo *this_01;
  
  ChangeEntryPoint(this,(ProxyEntryPointInfo *)entryPointInfo,entryPoint);
  p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)this);
  bVar2 = CrossSite::IsThunk(p_Var5);
  if (!bVar2) {
    return entryPoint;
  }
  iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])(this);
  if (iVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x13d,"(this->IsCrossSiteObject())","this->IsCrossSiteObject()");
    if (!bVar2) goto LAB_00d47c29;
    *puVar6 = 0;
  }
  if (entryPoint != ScriptContext::DebugProfileProbeThunk) {
    return entryPoint;
  }
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
  BVar4 = FunctionBody::IsInterpreterThunk(this_00);
  if ((BVar4 == 0) && (BVar4 = FunctionBody::IsNativeOriginalEntryPoint(this_00), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x145,
                                "(functionBody->IsInterpreterThunk() || functionBody->IsNativeOriginalEntryPoint())"
                                ,
                                "functionBody->IsInterpreterThunk() || functionBody->IsNativeOriginalEntryPoint()"
                               );
    if (!bVar2) goto LAB_00d47c29;
    *puVar6 = 0;
  }
  this_01 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (this_01 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4d5,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00d47c29;
    *puVar6 = 0;
    this_01 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(this_01->functionBodyImpl).ptr != this_00) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4d6,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_00d47c29:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    this_01 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  p_Var5 = FunctionInfo::GetOriginalEntryPoint(this_01);
  return p_Var5;
}

Assistant:

JavascriptMethod ScriptFunction::UpdateThunkEntryPoint(FunctionEntryPointInfo* entryPointInfo, JavascriptMethod entryPoint)
    {
        this->ChangeEntryPoint(entryPointInfo, entryPoint);

        if (!CrossSite::IsThunk(this->GetEntryPoint()))
        {
            return entryPoint;
        }

        // We already pass through the cross site thunk, which would have called the profile thunk already if necessary
        // So just call the original entry point if our direct entry is the profile entry thunk
        // Otherwise, call the directEntryPoint which may have additional processing to do (e.g. ensure dynamic profile)
        Assert(this->IsCrossSiteObject());
        if (entryPoint != ProfileEntryThunk)
        {
            return entryPoint;
        }
        // Based on the comment below, this shouldn't be a defer deserialization function as it would have a deferred thunk
        FunctionBody * functionBody = this->GetFunctionBody();
        // The original entry point should be an interpreter thunk or the native entry point;
        Assert(functionBody->IsInterpreterThunk() || functionBody->IsNativeOriginalEntryPoint());
        return functionBody->GetOriginalEntryPoint();
    }